

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.h
# Opt level: O1

void __thiscall
jaegertracing::Span::
logFieldsNoLocking<__gnu_cxx::__normal_iterator<jaegertracing::Tag*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>>
          (Span *this,time_point *timestamp,
          __normal_iterator<jaegertracing::Tag_*,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>
          first,__normal_iterator<jaegertracing::Tag_*,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>
                last)

{
  LogRecord log;
  allocator_type local_31;
  undefined1 local_30 [32];
  
  local_30._0_8_ = (timestamp->__d).__r;
  std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>::
  vector<__gnu_cxx::__normal_iterator<jaegertracing::Tag*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>,void>
            ((vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>> *)(local_30 + 8),first,
             last,&local_31);
  std::vector<jaegertracing::LogRecord,_std::allocator<jaegertracing::LogRecord>_>::push_back
            (&this->_logs,(value_type *)local_30);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
            ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)(local_30 + 8));
  return;
}

Assistant:

void logFieldsNoLocking(const std::chrono::system_clock::time_point& timestamp, FieldIterator first, FieldIterator last) noexcept
    {
        LogRecord log(timestamp, first, last);
        _logs.push_back(log);
    }